

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::unames_cleanup(void)

{
  if (uCharNamesData != (UDataMemory *)0x0) {
    udata_close_63(uCharNamesData);
    uCharNamesData = (UDataMemory *)0x0;
  }
  if (uCharNames != 0) {
    uCharNames = 0;
  }
  LOCK();
  gCharNamesInitOnce = 0;
  UNLOCK();
  gMaxNameLength = 0;
  return '\x01';
}

Assistant:

static UBool U_CALLCONV unames_cleanup(void)
{
    if(uCharNamesData) {
        udata_close(uCharNamesData);
        uCharNamesData = NULL;
    }
    if(uCharNames) {
        uCharNames = NULL;
    }
    gCharNamesInitOnce.reset();
    gMaxNameLength=0;
    return TRUE;
}